

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World_3df.cpp
# Opt level: O2

void __thiscall
World_3df::inverse(World_3df *this,shared_ptr<Population> *param_1,shared_ptr<Population> *dst)

{
  bool bVar1;
  type pFVar2;
  type pPVar3;
  creat_t *pcVar4;
  type pCVar5;
  uint64_t val;
  uint64_t uVar6;
  ostream *poVar7;
  long val_00;
  long val_01;
  long lVar8;
  size_t sVar9;
  Msg local_3c0;
  Msg local_390;
  Msg local_360;
  Msg local_330;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  Msg local_240;
  Msg local_210;
  Msg local_1e0;
  Msg local_1b0;
  Msg local_180;
  Msg local_150;
  Msg local_120;
  double local_f0;
  double local_e8;
  type local_e0;
  long local_d8;
  longlong local_d0;
  shared_ptr<Population> *local_c8;
  Msg local_c0;
  Msg local_90;
  shared_ptr<util::logging::File_logger> local_60;
  long local_50;
  World_3df *local_48;
  ulong local_40;
  allocator local_36;
  allocator local_35;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  ulong uVar10;
  
  local_150._vptr_Msg = (_func_int **)(this->super_World).LOGFILE.px;
  local_150.msg_txt._M_dataplus._M_p = (pointer)(this->super_World).LOGFILE.pn.pi_;
  if ((sp_counted_base *)local_150.msg_txt._M_dataplus._M_p != (sp_counted_base *)0x0) {
    LOCK();
    ((sp_counted_base *)local_150.msg_txt._M_dataplus._M_p)->use_count_ =
         ((sp_counted_base *)local_150.msg_txt._M_dataplus._M_p)->use_count_ + 1;
    UNLOCK();
  }
  local_48 = this;
  pFVar2 = boost::shared_ptr<util::logging::File_logger>::operator*
                     ((shared_ptr<util::logging::File_logger> *)&local_150);
  util::logging::Msg::Msg(&local_180,"Inwersja z p_i = ",L_NORM);
  util::logging::Msg::operator+(&local_90,&local_180,0.001);
  std::__cxx11::string::string((string *)&local_120,"...",(allocator *)&local_1b0);
  util::logging::Msg::operator+(&local_c0,&local_90,(string *)&local_120);
  (*(pFVar2->super_Ostream_logger).super_Logger._vptr_Logger[3])(pFVar2,&local_c0);
  util::logging::Msg::~Msg(&local_c0);
  std::__cxx11::string::~string((string *)&local_120);
  util::logging::Msg::~Msg(&local_90);
  util::logging::Msg::~Msg(&local_180);
  boost::detail::shared_count::~shared_count((shared_count *)&local_150.msg_txt);
  pPVar3 = boost::shared_ptr<Population>::operator->(dst);
  sVar9 = pPVar3->ELITE_SIZE;
  lVar8 = sVar9 << 4;
  val_00 = 0;
  local_50 = 0;
  local_c8 = dst;
  while( true ) {
    pPVar3 = boost::shared_ptr<Population>::operator->(dst);
    pcVar4 = Population::get_creatures(pPVar3);
    if ((ulong)((long)(pcVar4->
                      super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(pcVar4->
                      super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 4) <= sVar9) break;
    local_40 = sVar9;
    bVar1 = probability(0.001);
    uVar10 = local_40;
    if (bVar1) {
      pPVar3 = boost::shared_ptr<Population>::operator->(dst);
      pcVar4 = Population::get_creatures(pPVar3);
      pCVar5 = boost::shared_ptr<Creature>::operator->
                         ((shared_ptr<Creature> *)
                          ((long)&((pcVar4->
                                   super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->px + lVar8));
      local_f0 = pCVar5->fitness;
      val = frand(0x18);
      uVar6 = frand(0x18);
      val_01 = uVar6 + 0x1a;
      pPVar3 = boost::shared_ptr<Population>::operator->(dst);
      (*pPVar3->_vptr_Population[5])(pPVar3,local_40,val,val_01);
      pPVar3 = boost::shared_ptr<Population>::operator->(dst);
      pcVar4 = Population::get_creatures(pPVar3);
      local_d8 = lVar8;
      pCVar5 = boost::shared_ptr<Creature>::operator->
                         ((shared_ptr<Creature> *)
                          ((long)&((pcVar4->
                                   super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->px + lVar8));
      local_e8 = pCVar5->fitness;
      local_60.px = (local_48->super_World).LOGFILE.px;
      local_60.pn.pi_ = (local_48->super_World).LOGFILE.pn.pi_;
      if (local_60.pn.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_60.pn.pi_)->use_count_ = (local_60.pn.pi_)->use_count_ + 1;
        UNLOCK();
      }
      local_e0 = boost::shared_ptr<util::logging::File_logger>::operator*(&local_60);
      util::logging::Msg::Msg(&local_390,anon_var_dwarf_33fbb,L_NORM);
      util::logging::Msg::operator+(&local_330,&local_390,local_40);
      std::__cxx11::string::string((string *)&local_300,anon_var_dwarf_34027,&local_36);
      local_d0 = val_00;
      util::logging::Msg::operator+(&local_3c0,&local_330,&local_300);
      util::logging::Msg::operator+(&local_240,&local_3c0,val_01 - val);
      std::__cxx11::string::string((string *)&local_2e0,anon_var_dwarf_3403d,&local_35);
      util::logging::Msg::operator+(&local_360,&local_240,&local_2e0);
      util::logging::Msg::operator+(&local_1e0,&local_360,val);
      std::__cxx11::string::string((string *)&local_2c0," a ",&local_34);
      util::logging::Msg::operator+(&local_210,&local_1e0,&local_2c0);
      util::logging::Msg::operator+(&local_1b0,&local_210,val_01);
      std::__cxx11::string::string((string *)&local_2a0," {",&local_33);
      util::logging::Msg::operator+(&local_150,&local_1b0,&local_2a0);
      util::logging::Msg::operator+(&local_120,&local_150,local_f0);
      std::__cxx11::string::string((string *)&local_280," -> ",&local_32);
      util::logging::Msg::operator+(&local_180,&local_120,&local_280);
      util::logging::Msg::operator+(&local_90,&local_180,local_e8);
      std::__cxx11::string::string((string *)&local_260,"}",&local_31);
      util::logging::Msg::operator+(&local_c0,&local_90,&local_260);
      (*(local_e0->super_Ostream_logger).super_Logger._vptr_Logger[3])(local_e0,&local_c0);
      util::logging::Msg::~Msg(&local_c0);
      std::__cxx11::string::~string((string *)&local_260);
      util::logging::Msg::~Msg(&local_90);
      util::logging::Msg::~Msg(&local_180);
      std::__cxx11::string::~string((string *)&local_280);
      util::logging::Msg::~Msg(&local_120);
      util::logging::Msg::~Msg(&local_150);
      std::__cxx11::string::~string((string *)&local_2a0);
      util::logging::Msg::~Msg(&local_1b0);
      util::logging::Msg::~Msg(&local_210);
      std::__cxx11::string::~string((string *)&local_2c0);
      util::logging::Msg::~Msg(&local_1e0);
      util::logging::Msg::~Msg(&local_360);
      std::__cxx11::string::~string((string *)&local_2e0);
      util::logging::Msg::~Msg(&local_240);
      util::logging::Msg::~Msg(&local_3c0);
      std::__cxx11::string::~string((string *)&local_300);
      util::logging::Msg::~Msg(&local_330);
      util::logging::Msg::~Msg(&local_390);
      boost::detail::shared_count::~shared_count(&local_60.pn);
      poVar7 = std::operator<<((ostream *)&std::cout,"!! Inwersja na ");
      uVar10 = local_40;
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::endl<char,std::char_traits<char>>(poVar7);
      local_50 = local_50 + 1;
      val_00 = local_d0 + (val_01 - val);
      dst = local_c8;
      lVar8 = local_d8;
    }
    sVar9 = uVar10 + 1;
    lVar8 = lVar8 + 0x10;
  }
  local_1e0._vptr_Msg = (_func_int **)(local_48->super_World).LOGFILE.px;
  local_1e0.msg_txt._M_dataplus._M_p = (pointer)(local_48->super_World).LOGFILE.pn.pi_;
  if ((sp_counted_base *)local_1e0.msg_txt._M_dataplus._M_p != (sp_counted_base *)0x0) {
    LOCK();
    ((sp_counted_base *)local_1e0.msg_txt._M_dataplus._M_p)->use_count_ =
         ((sp_counted_base *)local_1e0.msg_txt._M_dataplus._M_p)->use_count_ + 1;
    UNLOCK();
  }
  pFVar2 = boost::shared_ptr<util::logging::File_logger>::operator*
                     ((shared_ptr<util::logging::File_logger> *)&local_1e0);
  util::logging::Msg::Msg(&local_150,"... W sumie ",L_NORM);
  util::logging::Msg::operator+(&local_120,&local_150,local_50);
  std::__cxx11::string::string((string *)&local_1b0," inwersji na ",(allocator *)&local_360);
  util::logging::Msg::operator+(&local_180,&local_120,(string *)&local_1b0);
  util::logging::Msg::operator+(&local_90,&local_180,val_00);
  std::__cxx11::string::string((string *)&local_210," genach",(allocator *)&local_240);
  util::logging::Msg::operator+(&local_c0,&local_90,(string *)&local_210);
  (*(pFVar2->super_Ostream_logger).super_Logger._vptr_Logger[3])(pFVar2,&local_c0);
  util::logging::Msg::~Msg(&local_c0);
  std::__cxx11::string::~string((string *)&local_210);
  util::logging::Msg::~Msg(&local_90);
  util::logging::Msg::~Msg(&local_180);
  std::__cxx11::string::~string((string *)&local_1b0);
  util::logging::Msg::~Msg(&local_120);
  util::logging::Msg::~Msg(&local_150);
  boost::detail::shared_count::~shared_count((shared_count *)&local_1e0.msg_txt);
  local_90._vptr_Msg = (_func_int **)(local_48->super_World).LOGFILE.px;
  local_90.msg_txt._M_dataplus._M_p = (pointer)(local_48->super_World).LOGFILE.pn.pi_;
  if ((sp_counted_base *)local_90.msg_txt._M_dataplus._M_p != (sp_counted_base *)0x0) {
    LOCK();
    ((sp_counted_base *)local_90.msg_txt._M_dataplus._M_p)->use_count_ =
         ((sp_counted_base *)local_90.msg_txt._M_dataplus._M_p)->use_count_ + 1;
    UNLOCK();
  }
  pFVar2 = boost::shared_ptr<util::logging::File_logger>::operator*
                     ((shared_ptr<util::logging::File_logger> *)&local_90);
  util::logging::Msg::Msg(&local_c0,anon_var_dwarf_33f1d,L_NORM);
  (*(pFVar2->super_Ostream_logger).super_Logger._vptr_Logger[3])(pFVar2,&local_c0);
  util::logging::Msg::~Msg(&local_c0);
  boost::detail::shared_count::~shared_count((shared_count *)&local_90.msg_txt);
  return;
}

Assistant:

void World_3df::inverse( shared_ptr<Population>&, boost::shared_ptr<Population>& dst )
{
	const double prob = 0.001;

	(*get_log()) << util::logging::Msg("Inwersja z p_i = ") + prob + "...";

	size_t mcc = 0, mccc = 0;
	for(size_t i = dst->ELITE_SIZE; i < dst->get_creatures().size(); ++i)
	{
		if(probability(prob))
		{
			double m1 = dst->get_creatures()[i]->get_fitness();
			size_t p1 = frand(CHROMSIZE / 2 - 1), p2 = (CHROMSIZE / 2 + 1) + frand(CHROMSIZE / 2 - 1);

			dst->inverse(i, p1, p2);

			double m2 = dst->get_creatures()[i]->get_fitness();

			(*get_log()) << util::logging::Msg("... Stwór @ [") + static_cast<long long> (i)
					+ "] zaliczył inwersję na " + static_cast<long long> (p2 - p1) + " genach między "
					+ static_cast<long long> (p1) + " a " + static_cast<long long> (p2) + " {" + m1 + " -> " + m2 + "}";

			std::cout << "!! Inwersja na " << i << std::endl;

			mcc++;
			mccc += p2 - p1;
		}

	}
	(*get_log()) << util::logging::Msg("... W sumie ") + static_cast<long long> (mcc) + " inwersji na "
			+ static_cast<long long> (mccc) + " genach";

	(*get_log()) << "Już";
}